

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::ByteSizeLong(VisionFeaturePrint *this)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  if (this->_oneof_case_[0] == 0x15) {
    sVar3 = VisionFeaturePrint_Objects::ByteSizeLong((this->VisionFeaturePrintType_).objects_);
  }
  else {
    if (this->_oneof_case_[0] != 0x14) {
      sVar3 = 0;
      goto LAB_002e57d9;
    }
    sVar3 = VisionFeaturePrint_Scene::ByteSizeLong((this->VisionFeaturePrintType_).scene_);
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 2;
LAB_002e57d9:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t VisionFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (VisionFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
    case kScene: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.scene_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
    case kObjects: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.objects_);
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}